

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O3

void __thiscall
OptionParser::parseReactOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  string *s1;
  string *s1_00;
  pointer pcVar1;
  bool bVar2;
  InputError *pIVar3;
  ValueOption option;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  double local_58;
  double value;
  undefined1 local_40 [16];
  
  s1_00 = (tokenList->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)s1_00) < 0x41) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    InputError::InputError(pIVar3,2,&local_f8);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar2 = Utilities::parseNumber<double>(s1_00 + 2,&local_58);
  if (bVar2) {
    value = (double)local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"ORDER","");
    bVar2 = Utilities::match(s1_00,(string *)&value);
    if ((undefined1 *)value != local_40) {
      operator_delete((void *)value);
    }
    if (bVar2) {
      value = (double)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"BULK","");
      s1 = s1_00 + 1;
      bVar2 = Utilities::match(s1,(string *)&value);
      if ((undefined1 *)value != local_40) {
        operator_delete((void *)value);
      }
      if (bVar2) {
        option = BULK_ORDER;
      }
      else {
        value = (double)local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value,"WALL","");
        bVar2 = Utilities::match(s1,(string *)&value);
        if ((undefined1 *)value != local_40) {
          operator_delete((void *)value);
        }
        if (bVar2) {
          option = WALL_ORDER;
        }
        else {
          value = (double)local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&value,"TANK","");
          bVar2 = Utilities::match(s1,(string *)&value);
          if ((undefined1 *)value != local_40) {
            operator_delete((void *)value);
          }
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            pcVar1 = s1_00[1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,pcVar1,pcVar1 + s1_00[1]._M_string_length);
            InputError::InputError(pIVar3,3,&local_b8);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          option = TANK_ORDER;
        }
      }
    }
    else {
      value = (double)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"GLOBAL","");
      bVar2 = Utilities::match(s1_00,(string *)&value);
      if ((undefined1 *)value != local_40) {
        operator_delete((void *)value);
      }
      if (bVar2) {
        value = (double)local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value,"BULK","");
        bVar2 = Utilities::match(s1_00 + 1,(string *)&value);
        if ((undefined1 *)value != local_40) {
          operator_delete((void *)value);
        }
        if (bVar2) {
          option = BULK_COEFF;
        }
        else {
          value = (double)local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&value,"WALL","");
          bVar2 = Utilities::match(s1_00 + 1,(string *)&value);
          if ((undefined1 *)value != local_40) {
            operator_delete((void *)value);
          }
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            pcVar1 = s1_00[1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar1,pcVar1 + s1_00[1]._M_string_length);
            InputError::InputError(pIVar3,3,&local_98);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          option = WALL_COEFF;
        }
      }
      else {
        value = (double)local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value,"LIMITING","");
        bVar2 = Utilities::match(s1_00,(string *)&value);
        if ((undefined1 *)value != local_40) {
          operator_delete((void *)value);
        }
        if (bVar2) {
          option = LIMITING_CONCEN;
        }
        else {
          value = (double)local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&value,"ROUGHNESS","");
          bVar2 = Utilities::match(s1_00,(string *)&value);
          if ((undefined1 *)value != local_40) {
            operator_delete((void *)value);
          }
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            pcVar1 = (s1_00->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,pcVar1,pcVar1 + s1_00->_M_string_length);
            InputError::InputError(pIVar3,3,&local_78);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          option = ROUGHNESS_FACTOR;
        }
      }
    }
    Options::setOption(&network->options,option,local_58);
    return;
  }
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar1 = s1_00[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + s1_00[2]._M_string_length);
  InputError::InputError(pIVar3,6,&local_d8);
  __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void OptionParser::parseReactOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read reaction value (3rd token)

    double value;
    if ( !Utilities::parseNumber(tokens[2], value) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }

    // ... reaction order options

    if (Utilities::match(tokens[0], w_ORDER))
    {
        if (Utilities::match(tokens[1], w_BULK))
        {
            network->options.setOption(Options::BULK_ORDER, value);
        }
        else if (Utilities::match(tokens[1], w_WALL))
        {
            network->options.setOption(Options::WALL_ORDER, value);
        }
        else if (Utilities::match(tokens[1], w_TANK))
        {
            network->options.setOption(Options::TANK_ORDER, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... global reaction rate coeffs.

    else if (Utilities::match(tokens[0], w_GLOBAL))
    {
        if (Utilities::match(tokens[1], w_BULK))
        {
            network->options.setOption(Options::BULK_COEFF, value);
        }
        else if (Utilities::match(tokens[1], w_WALL))
        {
            network->options.setOption(Options::WALL_COEFF, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... limiting concentration option

    else if (Utilities::match(tokens[0], w_LIMITING))
    {
        network->options.setOption(Options::LIMITING_CONCEN, value);
    }

    // ... wall demand roughness correlation option

    else if (Utilities::match(tokens[0], w_ROUGHNESS))
    {
        network->options.setOption(Options::ROUGHNESS_FACTOR, value);
    }

    else throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
}